

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_16777232,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvMBIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  Geometry *pGVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  byte bVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  AABBNodeMB4D *node1;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  uint uVar27;
  ulong *puVar28;
  ulong uVar29;
  Scene *pSVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar43;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar42;
  undefined1 auVar41 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar52 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar53 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar56 [16];
  float fVar54;
  float fVar70;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar55;
  float fVar66;
  float fVar68;
  float fVar69;
  float fVar71;
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  float fVar65;
  float fVar67;
  undefined1 auVar64 [64];
  float fVar72;
  float fVar86;
  float fVar87;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar88;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  float fVar89;
  float fVar90;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar101;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  float fVar102;
  undefined1 auVar96 [64];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [64];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [64];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [64];
  float fVar120;
  float fVar121;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar130;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar128;
  float fVar129;
  undefined1 auVar127 [64];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [64];
  undefined1 auVar135 [16];
  undefined1 auVar136 [64];
  float fVar137;
  undefined1 auVar138 [16];
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar139 [64];
  float fVar143;
  undefined1 auVar144 [16];
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar145 [64];
  float fVar149;
  undefined1 auVar150 [16];
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar151 [64];
  float fVar155;
  undefined1 auVar156 [16];
  float fVar161;
  undefined1 auVar157 [16];
  float fVar159;
  float fVar160;
  undefined1 auVar158 [64];
  float fVar162;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar163 [64];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined1 local_1559;
  undefined8 local_1558;
  float fStack_1550;
  float fStack_154c;
  int local_153c;
  undefined8 local_1538;
  float fStack_1530;
  float fStack_152c;
  undefined8 local_1528;
  float fStack_1520;
  float fStack_151c;
  RayQueryContext *local_1510;
  undefined1 local_1508 [16];
  undefined1 local_14f8 [16];
  undefined1 local_14e8 [16];
  undefined1 local_14d8 [16];
  undefined1 local_14c8 [16];
  undefined1 local_14b8 [16];
  undefined1 local_14a8 [16];
  undefined1 local_1498 [16];
  long local_1480;
  uint local_1478;
  uint local_1474;
  uint local_1470;
  undefined4 local_146c;
  undefined4 local_1468;
  undefined4 local_1464;
  uint local_1460;
  uint local_145c;
  uint local_1458;
  RTCFilterFunctionNArguments local_1448;
  undefined1 local_1418 [16];
  undefined1 local_1408 [16];
  undefined1 local_13f8 [16];
  undefined1 local_13e8 [16];
  undefined1 local_13d8 [16];
  undefined1 local_13c8 [16];
  undefined1 *local_13b8;
  undefined1 local_13a8 [16];
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [32];
  undefined1 local_1318 [32];
  undefined1 local_12f8 [32];
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8;
  ulong local_11d0 [564];
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8 != 8) {
    fVar3 = ray->tfar;
    auVar64 = ZEXT1664(ZEXT816(0) << 0x40);
    if (0.0 <= fVar3) {
      local_1510 = context;
      puVar28 = local_11d0;
      aVar5 = (ray->dir).field_0;
      auVar44 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar34._8_4_ = 0x7fffffff;
      auVar34._0_8_ = 0x7fffffff7fffffff;
      auVar34._12_4_ = 0x7fffffff;
      auVar34 = vandps_avx((undefined1  [16])aVar5,auVar34);
      auVar82._8_4_ = 0x219392ef;
      auVar82._0_8_ = 0x219392ef219392ef;
      auVar82._12_4_ = 0x219392ef;
      auVar34 = vcmpps_avx(auVar34,auVar82,1);
      auVar103._8_4_ = 0x3f800000;
      auVar103._0_8_ = 0x3f8000003f800000;
      auVar103._12_4_ = 0x3f800000;
      auVar82 = vdivps_avx(auVar103,(undefined1  [16])aVar5);
      auVar104._8_4_ = 0x5d5e0b6b;
      auVar104._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar104._12_4_ = 0x5d5e0b6b;
      auVar34 = vblendvps_avx(auVar82,auVar104,auVar34);
      auVar91._0_4_ = auVar34._0_4_ * 0.99999964;
      auVar91._4_4_ = auVar34._4_4_ * 0.99999964;
      auVar91._8_4_ = auVar34._8_4_ * 0.99999964;
      auVar91._12_4_ = auVar34._12_4_ * 0.99999964;
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      auVar119 = ZEXT3264(CONCAT428(uVar4,CONCAT424(uVar4,CONCAT420(uVar4,CONCAT416(uVar4,CONCAT412(
                                                  uVar4,CONCAT48(uVar4,CONCAT44(uVar4,uVar4))))))));
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      auVar127 = ZEXT3264(CONCAT428(uVar4,CONCAT424(uVar4,CONCAT420(uVar4,CONCAT416(uVar4,CONCAT412(
                                                  uVar4,CONCAT48(uVar4,CONCAT44(uVar4,uVar4))))))));
      uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar134 = ZEXT3264(CONCAT428(uVar4,CONCAT424(uVar4,CONCAT420(uVar4,CONCAT416(uVar4,CONCAT412(
                                                  uVar4,CONCAT48(uVar4,CONCAT44(uVar4,uVar4))))))));
      auVar73._0_4_ = auVar34._0_4_ * 1.0000004;
      auVar73._4_4_ = auVar34._4_4_ * 1.0000004;
      auVar73._8_4_ = auVar34._8_4_ * 1.0000004;
      auVar73._12_4_ = auVar34._12_4_ * 1.0000004;
      auVar34 = vshufps_avx(auVar91,auVar91,0);
      auVar136 = ZEXT3264(CONCAT1616(auVar34,auVar34));
      auVar34 = vmovshdup_avx(auVar91);
      auVar82 = vshufps_avx(auVar91,auVar91,0x55);
      auVar139 = ZEXT3264(CONCAT1616(auVar82,auVar82));
      auVar82 = vshufpd_avx(auVar91,auVar91,1);
      auVar103 = vshufps_avx(auVar91,auVar91,0xaa);
      auVar145 = ZEXT3264(CONCAT1616(auVar103,auVar103));
      auVar103 = vshufps_avx(auVar73,auVar73,0);
      auVar151 = ZEXT3264(CONCAT1616(auVar103,auVar103));
      uVar29 = (ulong)(auVar91._0_4_ < 0.0) << 5;
      auVar103 = vshufps_avx(auVar73,auVar73,0x55);
      auVar96 = ZEXT1664(auVar103);
      auVar109 = ZEXT3264(CONCAT1616(auVar103,auVar103));
      auVar103 = vshufps_avx(auVar73,auVar73,0xaa);
      auVar85 = ZEXT1664(auVar103);
      uVar31 = (ulong)(auVar34._0_4_ < 0.0) << 5 | 0x40;
      auVar113 = ZEXT3264(CONCAT1616(auVar103,auVar103));
      uVar25 = (ulong)(auVar82._0_4_ < 0.0) << 5 | 0x80;
      uVar32 = uVar29 ^ 0x20;
      auVar34 = vshufps_avx(auVar44,auVar44,0);
      auVar53 = ZEXT1664(auVar34);
      auVar158 = ZEXT3264(CONCAT1616(auVar34,auVar34));
      auVar34 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
      auVar163 = ZEXT3264(CONCAT1616(auVar34,auVar34));
      local_1418 = mm_lookupmask_ps._240_16_;
      do {
        uVar33 = puVar28[-1];
        puVar28 = puVar28 + -1;
        while( true ) {
          local_11f8 = auVar119._0_32_;
          local_1218 = auVar127._0_32_;
          local_1238 = auVar134._0_32_;
          if ((uVar33 & 8) != 0) break;
          uVar22 = uVar33 & 0xfffffffffffffff0;
          fVar3 = (ray->dir).field_0.m128[3];
          auVar41._4_4_ = fVar3;
          auVar41._0_4_ = fVar3;
          auVar41._8_4_ = fVar3;
          auVar41._12_4_ = fVar3;
          auVar41._16_4_ = fVar3;
          auVar41._20_4_ = fVar3;
          auVar41._24_4_ = fVar3;
          auVar41._28_4_ = fVar3;
          pfVar2 = (float *)(uVar22 + 0x100 + uVar29);
          pfVar1 = (float *)(uVar22 + 0x40 + uVar29);
          auVar52._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar52._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar52._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar52._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar52._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar52._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar52._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar52._28_4_ = auVar53._28_4_ + pfVar1[7];
          auVar52 = vsubps_avx(auVar52,local_11f8);
          auVar15._4_4_ = auVar136._4_4_ * auVar52._4_4_;
          auVar15._0_4_ = auVar136._0_4_ * auVar52._0_4_;
          auVar15._8_4_ = auVar136._8_4_ * auVar52._8_4_;
          auVar15._12_4_ = auVar136._12_4_ * auVar52._12_4_;
          auVar15._16_4_ = auVar136._16_4_ * auVar52._16_4_;
          auVar15._20_4_ = auVar136._20_4_ * auVar52._20_4_;
          auVar15._24_4_ = auVar136._24_4_ * auVar52._24_4_;
          auVar15._28_4_ = auVar52._28_4_;
          auVar52 = vmaxps_avx(auVar158._0_32_,auVar15);
          pfVar2 = (float *)(uVar22 + 0x100 + uVar31);
          pfVar1 = (float *)(uVar22 + 0x40 + uVar31);
          auVar62._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar62._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar62._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar62._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar62._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar62._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar62._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar62._28_4_ = auVar64._28_4_ + pfVar1[7];
          auVar15 = vsubps_avx(auVar62,local_1218);
          auVar17._4_4_ = auVar139._4_4_ * auVar15._4_4_;
          auVar17._0_4_ = auVar139._0_4_ * auVar15._0_4_;
          auVar17._8_4_ = auVar139._8_4_ * auVar15._8_4_;
          auVar17._12_4_ = auVar139._12_4_ * auVar15._12_4_;
          auVar17._16_4_ = auVar139._16_4_ * auVar15._16_4_;
          auVar17._20_4_ = auVar139._20_4_ * auVar15._20_4_;
          auVar17._24_4_ = auVar139._24_4_ * auVar15._24_4_;
          auVar17._28_4_ = auVar15._28_4_;
          pfVar2 = (float *)(uVar22 + 0x100 + uVar25);
          pfVar1 = (float *)(uVar22 + 0x40 + uVar25);
          auVar83._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar83._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar83._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar83._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar83._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar83._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar83._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar83._28_4_ = auVar85._28_4_ + pfVar1[7];
          auVar62 = vsubps_avx(auVar83,local_1238);
          auVar18._4_4_ = auVar145._4_4_ * auVar62._4_4_;
          auVar18._0_4_ = auVar145._0_4_ * auVar62._0_4_;
          auVar18._8_4_ = auVar145._8_4_ * auVar62._8_4_;
          auVar18._12_4_ = auVar145._12_4_ * auVar62._12_4_;
          auVar18._16_4_ = auVar145._16_4_ * auVar62._16_4_;
          auVar18._20_4_ = auVar145._20_4_ * auVar62._20_4_;
          auVar18._24_4_ = auVar145._24_4_ * auVar62._24_4_;
          auVar18._28_4_ = auVar62._28_4_;
          auVar15 = vmaxps_avx(auVar17,auVar18);
          auVar52 = vmaxps_avx(auVar52,auVar15);
          pfVar2 = (float *)(uVar22 + 0x100 + uVar32);
          pfVar1 = (float *)(uVar22 + 0x40 + uVar32);
          auVar63._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar63._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar63._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar63._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar63._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar63._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar63._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar63._28_4_ = auVar15._28_4_ + pfVar1[7];
          auVar15 = vsubps_avx(auVar63,local_11f8);
          auVar19._4_4_ = auVar151._4_4_ * auVar15._4_4_;
          auVar19._0_4_ = auVar151._0_4_ * auVar15._0_4_;
          auVar19._8_4_ = auVar151._8_4_ * auVar15._8_4_;
          auVar19._12_4_ = auVar151._12_4_ * auVar15._12_4_;
          auVar19._16_4_ = auVar151._16_4_ * auVar15._16_4_;
          auVar19._20_4_ = auVar151._20_4_ * auVar15._20_4_;
          auVar19._24_4_ = auVar151._24_4_ * auVar15._24_4_;
          auVar19._28_4_ = auVar15._28_4_;
          pfVar2 = (float *)(uVar22 + 0x100 + (uVar31 ^ 0x20));
          auVar15 = vminps_avx(auVar163._0_32_,auVar19);
          pfVar1 = (float *)(uVar22 + 0x40 + (uVar31 ^ 0x20));
          auVar84._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar84._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar84._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar84._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar84._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar84._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar84._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar84._28_4_ = auVar62._28_4_ + pfVar1[7];
          auVar62 = vsubps_avx(auVar84,local_1218);
          pfVar2 = (float *)(uVar22 + 0x100 + (uVar25 ^ 0x20));
          pfVar1 = (float *)(uVar22 + 0x40 + (uVar25 ^ 0x20));
          auVar95._0_4_ = fVar3 * *pfVar2 + *pfVar1;
          auVar95._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
          auVar95._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
          auVar95._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
          auVar95._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
          auVar95._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
          auVar95._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
          auVar95._28_4_ = auVar96._28_4_ + pfVar1[7];
          auVar20._4_4_ = auVar109._4_4_ * auVar62._4_4_;
          auVar20._0_4_ = auVar109._0_4_ * auVar62._0_4_;
          auVar20._8_4_ = auVar109._8_4_ * auVar62._8_4_;
          auVar20._12_4_ = auVar109._12_4_ * auVar62._12_4_;
          auVar20._16_4_ = auVar109._16_4_ * auVar62._16_4_;
          auVar20._20_4_ = auVar109._20_4_ * auVar62._20_4_;
          auVar20._24_4_ = auVar109._24_4_ * auVar62._24_4_;
          auVar20._28_4_ = auVar62._28_4_;
          auVar62 = vsubps_avx(auVar95,local_1238);
          auVar21._4_4_ = auVar113._4_4_ * auVar62._4_4_;
          auVar21._0_4_ = auVar113._0_4_ * auVar62._0_4_;
          auVar21._8_4_ = auVar113._8_4_ * auVar62._8_4_;
          auVar21._12_4_ = auVar113._12_4_ * auVar62._12_4_;
          auVar21._16_4_ = auVar113._16_4_ * auVar62._16_4_;
          auVar21._20_4_ = auVar113._20_4_ * auVar62._20_4_;
          auVar21._24_4_ = auVar113._24_4_ * auVar62._24_4_;
          auVar21._28_4_ = auVar62._28_4_;
          auVar96 = ZEXT3264(auVar21);
          auVar62 = vminps_avx(auVar20,auVar21);
          auVar85 = ZEXT3264(auVar62);
          auVar15 = vminps_avx(auVar15,auVar62);
          auVar52 = vcmpps_avx(auVar52,auVar15,2);
          auVar53 = ZEXT3264(auVar52);
          if (((uint)uVar33 & 7) == 6) {
            auVar15 = vcmpps_avx(*(undefined1 (*) [32])(uVar22 + 0x1c0),auVar41,2);
            auVar62 = vcmpps_avx(auVar41,*(undefined1 (*) [32])(uVar22 + 0x1e0),1);
            auVar62 = vandps_avx(auVar15,auVar62);
            auVar52 = vandps_avx(auVar62,auVar52);
            auVar53 = ZEXT1664(auVar52._16_16_);
            auVar34 = vpackssdw_avx(auVar52._0_16_,auVar52._16_16_);
          }
          else {
            auVar34 = vpackssdw_avx(auVar52._0_16_,auVar52._16_16_);
          }
          auVar64 = ZEXT3264(auVar15);
          auVar34 = vpsllw_avx(auVar34,0xf);
          if ((((((((auVar34 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar34 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar34 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar34 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar34 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar34 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar34 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar34[0xf]) goto LAB_002e86a8;
          auVar34 = vpacksswb_avx(auVar34,auVar34);
          bVar16 = SUB161(auVar34 >> 7,0) & 1 | (SUB161(auVar34 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar34 >> 0x17,0) & 1) << 2 | (SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar34 >> 0x27,0) & 1) << 4 | (SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar34 >> 0x37,0) & 1) << 6 | SUB161(auVar34 >> 0x3f,0) << 7;
          lVar26 = 0;
          if (bVar16 != 0) {
            for (; (bVar16 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
            }
          }
          uVar33 = *(ulong *)(uVar22 + lVar26 * 8);
          uVar27 = bVar16 - 1 & (uint)bVar16;
          if (uVar27 != 0) {
            *puVar28 = uVar33;
            puVar28 = puVar28 + 1;
            lVar26 = 0;
            if (uVar27 != 0) {
              for (; (uVar27 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
              }
            }
            uVar33 = *(ulong *)(uVar22 + lVar26 * 8);
            uVar27 = uVar27 - 1 & uVar27;
            uVar23 = (ulong)uVar27;
            if (uVar27 != 0) {
              do {
                *puVar28 = uVar33;
                puVar28 = puVar28 + 1;
                lVar26 = 0;
                if (uVar23 != 0) {
                  for (; (uVar23 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
                  }
                }
                uVar33 = *(ulong *)(uVar22 + lVar26 * 8);
                uVar23 = uVar23 & uVar23 - 1;
              } while (uVar23 != 0);
            }
          }
        }
        lVar26 = (ulong)((uint)uVar33 & 0xf) - 8;
        if (lVar26 != 0) {
          uVar33 = uVar33 & 0xfffffffffffffff0;
          local_1480 = 0;
          local_1258 = auVar136._0_32_;
          local_1278 = auVar139._0_32_;
          local_1298 = auVar145._0_32_;
          local_12b8 = auVar151._0_32_;
          local_12d8 = auVar109._0_32_;
          local_12f8 = auVar113._0_32_;
          local_1318 = auVar158._0_32_;
          local_1338 = auVar163._0_32_;
          do {
            lVar24 = local_1480 * 0x140;
            fVar3 = (ray->dir).field_0.m128[3];
            pfVar2 = (float *)(uVar33 + 0x90 + lVar24);
            pfVar1 = (float *)(uVar33 + lVar24);
            auVar44._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar44._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar44._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar44._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar33 + 0xa0 + lVar24);
            pfVar1 = (float *)(uVar33 + 0x10 + lVar24);
            auVar56._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar56._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar56._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar56._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar33 + 0xb0 + lVar24);
            pfVar1 = (float *)(uVar33 + 0x20 + lVar24);
            auVar138._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar138._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar138._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar138._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar33 + 0xc0 + lVar24);
            pfVar1 = (float *)(uVar33 + 0x30 + lVar24);
            auVar92._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar92._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar92._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar92._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar33 + 0xd0 + lVar24);
            pfVar1 = (float *)(uVar33 + 0x40 + lVar24);
            auVar105._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar105._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar105._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar105._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar33 + 0xe0 + lVar24);
            pfVar1 = (float *)(uVar33 + 0x50 + lVar24);
            auVar144._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar144._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar144._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar144._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar33 + 0xf0 + lVar24);
            pfVar1 = (float *)(uVar33 + 0x60 + lVar24);
            auVar122._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar122._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar122._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar122._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar33 + 0x100 + lVar24);
            pfVar1 = (float *)(uVar33 + 0x70 + lVar24);
            auVar131._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar131._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar131._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar131._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            pfVar1 = (float *)(uVar33 + 0x110 + lVar24);
            pfVar2 = (float *)(uVar33 + 0x80 + lVar24);
            auVar35._0_4_ = fVar3 * *pfVar1 + *pfVar2;
            auVar35._4_4_ = fVar3 * pfVar1[1] + pfVar2[1];
            auVar35._8_4_ = fVar3 * pfVar1[2] + pfVar2[2];
            auVar35._12_4_ = fVar3 * pfVar1[3] + pfVar2[3];
            uVar4 = *(undefined4 *)&(ray->org).field_0;
            auVar135._4_4_ = uVar4;
            auVar135._0_4_ = uVar4;
            auVar135._8_4_ = uVar4;
            auVar135._12_4_ = uVar4;
            uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar150._4_4_ = uVar4;
            auVar150._0_4_ = uVar4;
            auVar150._8_4_ = uVar4;
            auVar150._12_4_ = uVar4;
            uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar156._4_4_ = uVar4;
            auVar156._0_4_ = uVar4;
            auVar156._8_4_ = uVar4;
            auVar156._12_4_ = uVar4;
            local_1498 = vsubps_avx(auVar44,auVar135);
            local_14f8 = vsubps_avx(auVar56,auVar150);
            local_1508 = vsubps_avx(auVar138,auVar156);
            auVar34 = vsubps_avx(auVar92,auVar135);
            auVar82 = vsubps_avx(auVar105,auVar150);
            auVar44 = vsubps_avx(auVar144,auVar156);
            auVar103 = vsubps_avx(auVar122,auVar135);
            auVar73 = vsubps_avx(auVar131,auVar150);
            auVar91 = vsubps_avx(auVar35,auVar156);
            local_14a8 = vsubps_avx(auVar103,local_1498);
            local_14b8 = vsubps_avx(auVar73,local_14f8);
            local_14c8 = vsubps_avx(auVar91,local_1508);
            fVar3 = local_14f8._0_4_;
            fVar54 = auVar73._0_4_ + fVar3;
            fVar9 = local_14f8._4_4_;
            fVar65 = auVar73._4_4_ + fVar9;
            fVar71 = local_14f8._8_4_;
            fVar67 = auVar73._8_4_ + fVar71;
            fVar12 = local_14f8._12_4_;
            fVar70 = auVar73._12_4_ + fVar12;
            fVar7 = local_1508._0_4_;
            fVar89 = auVar91._0_4_ + fVar7;
            fVar66 = local_1508._4_4_;
            fVar97 = auVar91._4_4_ + fVar66;
            fVar10 = local_1508._8_4_;
            fVar99 = auVar91._8_4_ + fVar10;
            fVar13 = local_1508._12_4_;
            fVar101 = auVar91._12_4_ + fVar13;
            fVar55 = local_14c8._0_4_;
            auVar123._0_4_ = fVar55 * fVar54;
            fVar68 = local_14c8._4_4_;
            auVar123._4_4_ = fVar68 * fVar65;
            fVar42 = local_14c8._8_4_;
            auVar123._8_4_ = fVar42 * fVar67;
            fVar43 = local_14c8._12_4_;
            auVar123._12_4_ = fVar43 * fVar70;
            fVar162 = local_14b8._0_4_;
            auVar132._0_4_ = fVar162 * fVar89;
            fVar164 = local_14b8._4_4_;
            auVar132._4_4_ = fVar164 * fVar97;
            fVar165 = local_14b8._8_4_;
            auVar132._8_4_ = fVar165 * fVar99;
            fVar166 = local_14b8._12_4_;
            auVar132._12_4_ = fVar166 * fVar101;
            auVar104 = vsubps_avx(auVar132,auVar123);
            fVar8 = local_1498._0_4_;
            fVar120 = auVar103._0_4_ + fVar8;
            fVar69 = local_1498._4_4_;
            fVar128 = auVar103._4_4_ + fVar69;
            fVar11 = local_1498._8_4_;
            fVar129 = auVar103._8_4_ + fVar11;
            fVar14 = local_1498._12_4_;
            fVar130 = auVar103._12_4_ + fVar14;
            fVar155 = local_14a8._0_4_;
            auVar93._0_4_ = fVar155 * fVar89;
            fVar159 = local_14a8._4_4_;
            auVar93._4_4_ = fVar159 * fVar97;
            fVar160 = local_14a8._8_4_;
            auVar93._8_4_ = fVar160 * fVar99;
            fVar161 = local_14a8._12_4_;
            auVar93._12_4_ = fVar161 * fVar101;
            auVar133._0_4_ = fVar120 * fVar55;
            auVar133._4_4_ = fVar128 * fVar68;
            auVar133._8_4_ = fVar129 * fVar42;
            auVar133._12_4_ = fVar130 * fVar43;
            auVar35 = vsubps_avx(auVar133,auVar93);
            auVar124._0_4_ = fVar162 * fVar120;
            auVar124._4_4_ = fVar164 * fVar128;
            auVar124._8_4_ = fVar165 * fVar129;
            auVar124._12_4_ = fVar166 * fVar130;
            auVar36._0_4_ = fVar155 * fVar54;
            auVar36._4_4_ = fVar159 * fVar65;
            auVar36._8_4_ = fVar160 * fVar67;
            auVar36._12_4_ = fVar161 * fVar70;
            auVar36 = vsubps_avx(auVar36,auVar124);
            local_1528._4_4_ = (ray->dir).field_0.m128[2];
            local_1558._4_4_ = (ray->dir).field_0.m128[1];
            local_1538._4_4_ = (ray->dir).field_0.m128[0];
            local_14e8._0_4_ =
                 auVar104._0_4_ * local_1538._4_4_ +
                 local_1558._4_4_ * auVar35._0_4_ + local_1528._4_4_ * auVar36._0_4_;
            local_14e8._4_4_ =
                 auVar104._4_4_ * local_1538._4_4_ +
                 local_1558._4_4_ * auVar35._4_4_ + local_1528._4_4_ * auVar36._4_4_;
            local_14e8._8_4_ =
                 auVar104._8_4_ * local_1538._4_4_ +
                 local_1558._4_4_ * auVar35._8_4_ + local_1528._4_4_ * auVar36._8_4_;
            local_14e8._12_4_ =
                 auVar104._12_4_ * local_1538._4_4_ +
                 local_1558._4_4_ * auVar35._12_4_ + local_1528._4_4_ * auVar36._12_4_;
            local_14d8 = vsubps_avx(local_14f8,auVar82);
            auVar104 = vsubps_avx(local_1508,auVar44);
            fVar54 = fVar3 + auVar82._0_4_;
            fVar65 = fVar9 + auVar82._4_4_;
            fVar67 = fVar71 + auVar82._8_4_;
            fVar70 = fVar12 + auVar82._12_4_;
            fVar97 = auVar44._0_4_ + fVar7;
            fVar101 = auVar44._4_4_ + fVar66;
            fVar128 = auVar44._8_4_ + fVar10;
            fVar130 = auVar44._12_4_ + fVar13;
            fVar149 = auVar104._0_4_;
            auVar157._0_4_ = fVar149 * fVar54;
            fVar152 = auVar104._4_4_;
            auVar157._4_4_ = fVar152 * fVar65;
            fVar153 = auVar104._8_4_;
            auVar157._8_4_ = fVar153 * fVar67;
            fVar154 = auVar104._12_4_;
            auVar157._12_4_ = fVar154 * fVar70;
            fVar89 = local_14d8._0_4_;
            auVar74._0_4_ = fVar89 * fVar97;
            fVar99 = local_14d8._4_4_;
            auVar74._4_4_ = fVar99 * fVar101;
            fVar120 = local_14d8._8_4_;
            auVar74._8_4_ = fVar120 * fVar128;
            fVar129 = local_14d8._12_4_;
            auVar74._12_4_ = fVar129 * fVar130;
            auVar104 = vsubps_avx(auVar74,auVar157);
            auVar35 = vsubps_avx(local_1498,auVar34);
            fVar137 = auVar35._0_4_;
            auVar94._0_4_ = fVar137 * fVar97;
            fVar140 = auVar35._4_4_;
            auVar94._4_4_ = fVar140 * fVar101;
            fVar141 = auVar35._8_4_;
            auVar94._8_4_ = fVar141 * fVar128;
            fVar142 = auVar35._12_4_;
            auVar94._12_4_ = fVar142 * fVar130;
            fVar97 = auVar34._0_4_ + fVar8;
            fVar101 = auVar34._4_4_ + fVar69;
            fVar128 = auVar34._8_4_ + fVar11;
            fVar130 = auVar34._12_4_ + fVar14;
            auVar125._0_4_ = fVar149 * fVar97;
            auVar125._4_4_ = fVar152 * fVar101;
            auVar125._8_4_ = fVar153 * fVar128;
            auVar125._12_4_ = fVar154 * fVar130;
            auVar35 = vsubps_avx(auVar125,auVar94);
            auVar114._0_4_ = fVar89 * fVar97;
            auVar114._4_4_ = fVar99 * fVar101;
            auVar114._8_4_ = fVar120 * fVar128;
            auVar114._12_4_ = fVar129 * fVar130;
            auVar37._0_4_ = fVar137 * fVar54;
            auVar37._4_4_ = fVar140 * fVar65;
            auVar37._8_4_ = fVar141 * fVar67;
            auVar37._12_4_ = fVar142 * fVar70;
            auVar36 = vsubps_avx(auVar37,auVar114);
            local_13f8._0_4_ =
                 local_1538._4_4_ * auVar104._0_4_ +
                 local_1558._4_4_ * auVar35._0_4_ + local_1528._4_4_ * auVar36._0_4_;
            local_13f8._4_4_ =
                 local_1538._4_4_ * auVar104._4_4_ +
                 local_1558._4_4_ * auVar35._4_4_ + local_1528._4_4_ * auVar36._4_4_;
            local_13f8._8_4_ =
                 local_1538._4_4_ * auVar104._8_4_ +
                 local_1558._4_4_ * auVar35._8_4_ + local_1528._4_4_ * auVar36._8_4_;
            local_13f8._12_4_ =
                 local_1538._4_4_ * auVar104._12_4_ +
                 local_1558._4_4_ * auVar35._12_4_ + local_1528._4_4_ * auVar36._12_4_;
            auVar104 = vsubps_avx(auVar34,auVar103);
            fVar72 = auVar34._0_4_ + auVar103._0_4_;
            fVar86 = auVar34._4_4_ + auVar103._4_4_;
            fVar87 = auVar34._8_4_ + auVar103._8_4_;
            fVar88 = auVar34._12_4_ + auVar103._12_4_;
            auVar34 = vsubps_avx(auVar82,auVar73);
            fVar97 = auVar82._0_4_ + auVar73._0_4_;
            fVar101 = auVar82._4_4_ + auVar73._4_4_;
            fVar128 = auVar82._8_4_ + auVar73._8_4_;
            fVar130 = auVar82._12_4_ + auVar73._12_4_;
            auVar82 = vsubps_avx(auVar44,auVar91);
            auVar96 = ZEXT1664(auVar82);
            fVar54 = auVar44._0_4_ + auVar91._0_4_;
            fVar65 = auVar44._4_4_ + auVar91._4_4_;
            fVar67 = auVar44._8_4_ + auVar91._8_4_;
            fVar70 = auVar44._12_4_ + auVar91._12_4_;
            fVar90 = auVar82._0_4_;
            auVar106._0_4_ = fVar90 * fVar97;
            fVar98 = auVar82._4_4_;
            auVar106._4_4_ = fVar98 * fVar101;
            fVar100 = auVar82._8_4_;
            auVar106._8_4_ = fVar100 * fVar128;
            fVar102 = auVar82._12_4_;
            auVar106._12_4_ = fVar102 * fVar130;
            fVar143 = auVar34._0_4_;
            auVar115._0_4_ = fVar143 * fVar54;
            fVar146 = auVar34._4_4_;
            auVar115._4_4_ = fVar146 * fVar65;
            fVar147 = auVar34._8_4_;
            auVar115._8_4_ = fVar147 * fVar67;
            fVar148 = auVar34._12_4_;
            auVar115._12_4_ = fVar148 * fVar70;
            auVar34 = vsubps_avx(auVar115,auVar106);
            fVar121 = auVar104._0_4_;
            auVar45._0_4_ = fVar121 * fVar54;
            fVar54 = auVar104._4_4_;
            auVar45._4_4_ = fVar54 * fVar65;
            fVar65 = auVar104._8_4_;
            auVar45._8_4_ = fVar65 * fVar67;
            fVar67 = auVar104._12_4_;
            auVar45._12_4_ = fVar67 * fVar70;
            auVar116._0_4_ = fVar90 * fVar72;
            auVar116._4_4_ = fVar98 * fVar86;
            auVar116._8_4_ = fVar100 * fVar87;
            auVar116._12_4_ = fVar102 * fVar88;
            auVar82 = vsubps_avx(auVar116,auVar45);
            auVar75._0_4_ = fVar143 * fVar72;
            auVar75._4_4_ = fVar146 * fVar86;
            auVar75._8_4_ = fVar147 * fVar87;
            auVar75._12_4_ = fVar148 * fVar88;
            auVar57._0_4_ = fVar121 * fVar97;
            auVar57._4_4_ = fVar54 * fVar101;
            auVar57._8_4_ = fVar65 * fVar128;
            auVar57._12_4_ = fVar67 * fVar130;
            auVar44 = vsubps_avx(auVar57,auVar75);
            local_1528._0_4_ = local_1528._4_4_;
            fStack_1520 = local_1528._4_4_;
            fStack_151c = local_1528._4_4_;
            local_1558._0_4_ = local_1558._4_4_;
            fStack_1550 = local_1558._4_4_;
            fStack_154c = local_1558._4_4_;
            local_1538._0_4_ = local_1538._4_4_;
            fStack_1530 = local_1538._4_4_;
            fStack_152c = local_1538._4_4_;
            auVar46._0_4_ =
                 local_1538._4_4_ * auVar34._0_4_ +
                 local_1558._4_4_ * auVar82._0_4_ + local_1528._4_4_ * auVar44._0_4_;
            auVar46._4_4_ =
                 local_1538._4_4_ * auVar34._4_4_ +
                 local_1558._4_4_ * auVar82._4_4_ + local_1528._4_4_ * auVar44._4_4_;
            auVar46._8_4_ =
                 local_1538._4_4_ * auVar34._8_4_ +
                 local_1558._4_4_ * auVar82._8_4_ + local_1528._4_4_ * auVar44._8_4_;
            auVar46._12_4_ =
                 local_1538._4_4_ * auVar34._12_4_ +
                 local_1558._4_4_ * auVar82._12_4_ + local_1528._4_4_ * auVar44._12_4_;
            local_13c8._0_4_ = auVar46._0_4_ + local_14e8._0_4_ + local_13f8._0_4_;
            local_13c8._4_4_ = auVar46._4_4_ + local_14e8._4_4_ + local_13f8._4_4_;
            local_13c8._8_4_ = auVar46._8_4_ + local_14e8._8_4_ + local_13f8._8_4_;
            local_13c8._12_4_ = auVar46._12_4_ + local_14e8._12_4_ + local_13f8._12_4_;
            auVar34 = vminps_avx(local_14e8,local_13f8);
            auVar34 = vminps_avx(auVar34,auVar46);
            auVar76._8_4_ = 0x7fffffff;
            auVar76._0_8_ = 0x7fffffff7fffffff;
            auVar76._12_4_ = 0x7fffffff;
            local_1408 = vandps_avx(local_13c8,auVar76);
            auVar77._0_4_ = local_1408._0_4_ * 1.1920929e-07;
            auVar77._4_4_ = local_1408._4_4_ * 1.1920929e-07;
            auVar77._8_4_ = local_1408._8_4_ * 1.1920929e-07;
            auVar77._12_4_ = local_1408._12_4_ * 1.1920929e-07;
            auVar85 = ZEXT1664(auVar77);
            uVar22 = CONCAT44(auVar77._4_4_,auVar77._0_4_);
            auVar107._0_8_ = uVar22 ^ 0x8000000080000000;
            auVar107._8_4_ = -auVar77._8_4_;
            auVar107._12_4_ = -auVar77._12_4_;
            auVar34 = vcmpps_avx(auVar34,auVar107,5);
            auVar64 = ZEXT1664(auVar34);
            auVar82 = vmaxps_avx(local_14e8,local_13f8);
            auVar82 = vmaxps_avx(auVar82,auVar46);
            auVar82 = vcmpps_avx(auVar82,auVar77,2);
            auVar53 = ZEXT1664(auVar82);
            auVar34 = vorps_avx(auVar34,auVar82);
            auVar82 = local_1418 & auVar34;
            if ((((auVar82 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar82 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar82 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar82[0xf] < '\0') {
              auVar47._0_4_ = fVar89 * fVar55;
              auVar47._4_4_ = fVar99 * fVar68;
              auVar47._8_4_ = fVar120 * fVar42;
              auVar47._12_4_ = fVar129 * fVar43;
              auVar58._0_4_ = fVar162 * fVar149;
              auVar58._4_4_ = fVar164 * fVar152;
              auVar58._8_4_ = fVar165 * fVar153;
              auVar58._12_4_ = fVar166 * fVar154;
              auVar103 = vsubps_avx(auVar58,auVar47);
              auVar78._0_4_ = fVar149 * fVar143;
              auVar78._4_4_ = fVar152 * fVar146;
              auVar78._8_4_ = fVar153 * fVar147;
              auVar78._12_4_ = fVar154 * fVar148;
              auVar108._0_4_ = fVar89 * fVar90;
              auVar108._4_4_ = fVar99 * fVar98;
              auVar108._8_4_ = fVar120 * fVar100;
              auVar108._12_4_ = fVar129 * fVar102;
              auVar73 = vsubps_avx(auVar108,auVar78);
              auVar82 = vandps_avx(auVar76,auVar47);
              auVar44 = vandps_avx(auVar76,auVar78);
              auVar82 = vcmpps_avx(auVar82,auVar44,1);
              local_1368 = vblendvps_avx(auVar73,auVar103,auVar82);
              auVar48._0_4_ = fVar137 * fVar90;
              auVar48._4_4_ = fVar140 * fVar98;
              auVar48._8_4_ = fVar141 * fVar100;
              auVar48._12_4_ = fVar142 * fVar102;
              auVar59._0_4_ = fVar137 * fVar55;
              auVar59._4_4_ = fVar140 * fVar68;
              auVar59._8_4_ = fVar141 * fVar42;
              auVar59._12_4_ = fVar142 * fVar43;
              auVar79._0_4_ = fVar149 * fVar155;
              auVar79._4_4_ = fVar152 * fVar159;
              auVar79._8_4_ = fVar153 * fVar160;
              auVar79._12_4_ = fVar154 * fVar161;
              auVar103 = vsubps_avx(auVar59,auVar79);
              auVar110._0_4_ = fVar149 * fVar121;
              auVar110._4_4_ = fVar152 * fVar54;
              auVar110._8_4_ = fVar153 * fVar65;
              auVar110._12_4_ = fVar154 * fVar67;
              auVar73 = vsubps_avx(auVar110,auVar48);
              auVar82 = vandps_avx(auVar76,auVar79);
              auVar44 = vandps_avx(auVar76,auVar48);
              auVar82 = vcmpps_avx(auVar82,auVar44,1);
              local_1358 = vblendvps_avx(auVar73,auVar103,auVar82);
              auVar53 = ZEXT1664(local_1358);
              auVar96 = ZEXT1664(auVar34);
              auVar38._0_4_ = fVar89 * fVar121;
              auVar38._4_4_ = fVar99 * fVar54;
              auVar38._8_4_ = fVar120 * fVar65;
              auVar38._12_4_ = fVar129 * fVar67;
              auVar60._0_4_ = fVar89 * fVar155;
              auVar60._4_4_ = fVar99 * fVar159;
              auVar60._8_4_ = fVar120 * fVar160;
              auVar60._12_4_ = fVar129 * fVar161;
              auVar80._0_4_ = fVar162 * fVar137;
              auVar80._4_4_ = fVar164 * fVar140;
              auVar80._8_4_ = fVar165 * fVar141;
              auVar80._12_4_ = fVar166 * fVar142;
              auVar111._0_4_ = fVar137 * fVar143;
              auVar111._4_4_ = fVar140 * fVar146;
              auVar111._8_4_ = fVar141 * fVar147;
              auVar111._12_4_ = fVar142 * fVar148;
              auVar103 = vsubps_avx(auVar60,auVar80);
              auVar73 = vsubps_avx(auVar111,auVar38);
              auVar82 = vandps_avx(auVar76,auVar80);
              auVar44 = vandps_avx(auVar76,auVar38);
              auVar82 = vcmpps_avx(auVar82,auVar44,1);
              local_1348 = vblendvps_avx(auVar73,auVar103,auVar82);
              fVar55 = local_1368._0_4_ * local_1538._4_4_ +
                       local_1358._0_4_ * local_1558._4_4_ + local_1348._0_4_ * local_1528._4_4_;
              fVar54 = local_1368._4_4_ * local_1538._4_4_ +
                       local_1358._4_4_ * local_1558._4_4_ + local_1348._4_4_ * local_1528._4_4_;
              fVar68 = local_1368._8_4_ * local_1538._4_4_ +
                       local_1358._8_4_ * local_1558._4_4_ + local_1348._8_4_ * local_1528._4_4_;
              fVar65 = local_1368._12_4_ * local_1538._4_4_ +
                       local_1358._12_4_ * local_1558._4_4_ + local_1348._12_4_ * local_1528._4_4_;
              auVar81._0_4_ = fVar55 + fVar55;
              auVar81._4_4_ = fVar54 + fVar54;
              auVar81._8_4_ = fVar68 + fVar68;
              auVar81._12_4_ = fVar65 + fVar65;
              fVar55 = local_1368._0_4_ * fVar8 +
                       local_1358._0_4_ * fVar3 + local_1348._0_4_ * fVar7;
              fVar66 = local_1368._4_4_ * fVar69 +
                       local_1358._4_4_ * fVar9 + local_1348._4_4_ * fVar66;
              fVar69 = local_1368._8_4_ * fVar11 +
                       local_1358._8_4_ * fVar71 + local_1348._8_4_ * fVar10;
              fVar71 = local_1368._12_4_ * fVar14 +
                       local_1358._12_4_ * fVar12 + local_1348._12_4_ * fVar13;
              auVar82 = vrcpps_avx(auVar81);
              fVar3 = auVar82._0_4_;
              auVar117._0_4_ = auVar81._0_4_ * fVar3;
              fVar7 = auVar82._4_4_;
              auVar117._4_4_ = auVar81._4_4_ * fVar7;
              fVar8 = auVar82._8_4_;
              auVar117._8_4_ = auVar81._8_4_ * fVar8;
              fVar9 = auVar82._12_4_;
              auVar117._12_4_ = auVar81._12_4_ * fVar9;
              auVar126._8_4_ = 0x3f800000;
              auVar126._0_8_ = 0x3f8000003f800000;
              auVar126._12_4_ = 0x3f800000;
              auVar82 = vsubps_avx(auVar126,auVar117);
              local_1378._0_4_ = (fVar55 + fVar55) * (fVar3 + fVar3 * auVar82._0_4_);
              local_1378._4_4_ = (fVar66 + fVar66) * (fVar7 + fVar7 * auVar82._4_4_);
              local_1378._8_4_ = (fVar69 + fVar69) * (fVar8 + fVar8 * auVar82._8_4_);
              local_1378._12_4_ = (fVar71 + fVar71) * (fVar9 + fVar9 * auVar82._12_4_);
              auVar64 = ZEXT1664(local_1378);
              uVar4 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
              auVar112._4_4_ = uVar4;
              auVar112._0_4_ = uVar4;
              auVar112._8_4_ = uVar4;
              auVar112._12_4_ = uVar4;
              auVar82 = vcmpps_avx(auVar112,local_1378,2);
              fVar3 = ray->tfar;
              auVar118._4_4_ = fVar3;
              auVar118._0_4_ = fVar3;
              auVar118._8_4_ = fVar3;
              auVar118._12_4_ = fVar3;
              auVar44 = vcmpps_avx(local_1378,auVar118,2);
              auVar82 = vandps_avx(auVar82,auVar44);
              auVar44 = vcmpps_avx(auVar81,_DAT_01f7aa10,4);
              auVar82 = vandps_avx(auVar44,auVar82);
              auVar34 = vandps_avx(auVar34,local_1418);
              auVar82 = vpslld_avx(auVar82,0x1f);
              auVar82 = vpsrad_avx(auVar82,0x1f);
              local_13a8 = vpand_avx(auVar82,auVar34);
              auVar85 = ZEXT1664(local_13a8);
              uVar27 = vmovmskps_avx(local_13a8);
              if (uVar27 != 0) {
                local_1558 = lVar24 + uVar33;
                local_13e8 = local_14e8;
                auVar96 = ZEXT1664(local_13f8);
                local_13d8 = local_13f8;
                local_13b8 = &local_1559;
                auVar34 = vrcpps_avx(local_13c8);
                fVar3 = auVar34._0_4_;
                auVar49._0_4_ = local_13c8._0_4_ * fVar3;
                fVar7 = auVar34._4_4_;
                auVar49._4_4_ = local_13c8._4_4_ * fVar7;
                fVar8 = auVar34._8_4_;
                auVar49._8_4_ = local_13c8._8_4_ * fVar8;
                fVar9 = auVar34._12_4_;
                auVar49._12_4_ = local_13c8._12_4_ * fVar9;
                auVar61._8_4_ = 0x3f800000;
                auVar61._0_8_ = 0x3f8000003f800000;
                auVar61._12_4_ = 0x3f800000;
                auVar64 = ZEXT1664(auVar61);
                auVar34 = vsubps_avx(auVar61,auVar49);
                auVar39._0_4_ = fVar3 + fVar3 * auVar34._0_4_;
                auVar39._4_4_ = fVar7 + fVar7 * auVar34._4_4_;
                auVar39._8_4_ = fVar8 + fVar8 * auVar34._8_4_;
                auVar39._12_4_ = fVar9 + fVar9 * auVar34._12_4_;
                auVar50._8_4_ = 0x219392ef;
                auVar50._0_8_ = 0x219392ef219392ef;
                auVar50._12_4_ = 0x219392ef;
                auVar85 = ZEXT1664(local_1408);
                auVar34 = vcmpps_avx(local_1408,auVar50,5);
                auVar34 = vandps_avx(auVar34,auVar39);
                auVar51._0_4_ = local_14e8._0_4_ * auVar34._0_4_;
                auVar51._4_4_ = local_14e8._4_4_ * auVar34._4_4_;
                auVar51._8_4_ = local_14e8._8_4_ * auVar34._8_4_;
                auVar51._12_4_ = local_14e8._12_4_ * auVar34._12_4_;
                local_1398 = vminps_avx(auVar51,auVar61);
                auVar53 = ZEXT1664(local_1398);
                auVar40._0_4_ = local_13f8._0_4_ * auVar34._0_4_;
                auVar40._4_4_ = local_13f8._4_4_ * auVar34._4_4_;
                auVar40._8_4_ = local_13f8._8_4_ * auVar34._8_4_;
                auVar40._12_4_ = local_13f8._12_4_ * auVar34._12_4_;
                local_1388 = vminps_avx(auVar40,auVar61);
                uVar22 = (ulong)(uVar27 & 0xff);
                local_1528 = local_1510->scene;
                lVar24 = lVar24 + uVar33;
                pSVar30 = local_1510->scene;
                do {
                  uVar23 = 0;
                  if (uVar22 != 0) {
                    for (; (uVar22 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                    }
                  }
                  local_1460 = *(uint *)(lVar24 + 0x120 + uVar23 * 4);
                  pGVar6 = (pSVar30->geometries).items[local_1460].ptr;
                  if ((pGVar6->mask & ray->mask) == 0) {
                    uVar22 = uVar22 ^ 1L << (uVar23 & 0x3f);
                  }
                  else {
                    local_1538 = uVar23;
                    local_1498._0_8_ = uVar22;
                    if ((local_1510->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_002e86b8;
                    local_14f8._0_8_ = local_1510->args;
                    local_14c8._0_8_ = lVar26;
                    local_14b8._0_8_ = uVar29;
                    local_14a8._0_8_ = puVar28;
                    local_1448.context = local_1510->user;
                    local_1478 = *(uint *)(local_1368 + uVar23 * 4);
                    auVar34 = ZEXT416(local_1478);
                    local_1474 = *(uint *)(local_1358 + uVar23 * 4);
                    auVar82 = ZEXT416(local_1474);
                    local_1470 = *(uint *)(local_1348 + uVar23 * 4);
                    auVar44 = ZEXT416(local_1470);
                    local_146c = *(undefined4 *)(local_1398 + uVar23 * 4);
                    local_1468 = *(undefined4 *)(local_1388 + uVar23 * 4);
                    local_1464 = *(undefined4 *)(local_1558 + 0x130 + uVar23 * 4);
                    local_145c = (local_1448.context)->instID[0];
                    local_1458 = (local_1448.context)->instPrimID[0];
                    local_14d8._0_4_ = ray->tfar;
                    ray->tfar = *(float *)(local_1378 + uVar23 * 4);
                    local_153c = -1;
                    local_1448.valid = &local_153c;
                    local_1448.geometryUserPtr = pGVar6->userPtr;
                    local_1508._0_8_ = ray;
                    local_1448.hit = (RTCHitN *)&local_1478;
                    local_1448.N = 1;
                    local_14e8._0_8_ = pGVar6;
                    local_1448.ray = (RTCRayN *)ray;
                    if (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_002e8588:
                      ray = (Ray *)local_1508._0_8_;
                      if ((*(code **)(local_14f8._0_8_ + 0x10) == (code *)0x0) ||
                         (((*(byte *)local_14f8._0_8_ & 2) == 0 &&
                          ((*(byte *)(local_14e8._0_8_ + 0x3e) & 0x40) == 0)))) {
LAB_002e86b8:
                        ray->tfar = -INFINITY;
                        return;
                      }
                      auVar64 = ZEXT1664(auVar34);
                      auVar85 = ZEXT1664(auVar82);
                      auVar96 = ZEXT1664(auVar44);
                      (**(code **)(local_14f8._0_8_ + 0x10))(&local_1448);
                      auVar53._8_56_ = extraout_var_00;
                      auVar53._0_8_ = extraout_XMM1_Qa_00;
                      ray = (Ray *)local_1508._0_8_;
                      if (*local_1448.valid != 0) goto LAB_002e86b8;
                    }
                    else {
                      auVar64 = ZEXT464(local_1478);
                      auVar85 = ZEXT464(local_1474);
                      auVar96 = ZEXT464(local_1470);
                      (*pGVar6->occlusionFilterN)(&local_1448);
                      auVar44 = auVar96._0_16_;
                      auVar82 = auVar85._0_16_;
                      auVar34 = auVar64._0_16_;
                      auVar53._8_56_ = extraout_var;
                      auVar53._0_8_ = extraout_XMM1_Qa;
                      if (*local_1448.valid != 0) goto LAB_002e8588;
                    }
                    *(undefined4 *)(local_1508._0_8_ + 0x20) = local_14d8._0_4_;
                    uVar22 = local_1498._0_8_ ^ 1L << (local_1538 & 0x3f);
                    ray = (Ray *)local_1508._0_8_;
                    lVar26 = local_14c8._0_8_;
                    puVar28 = (ulong *)local_14a8._0_8_;
                    uVar29 = local_14b8._0_8_;
                  }
                  lVar24 = local_1558;
                  pSVar30 = local_1528;
                } while (uVar22 != 0);
              }
            }
            local_1480 = local_1480 + 1;
            auVar119 = ZEXT3264(local_11f8);
            auVar127 = ZEXT3264(local_1218);
            auVar134 = ZEXT3264(local_1238);
            auVar136 = ZEXT3264(local_1258);
            auVar139 = ZEXT3264(local_1278);
            auVar145 = ZEXT3264(local_1298);
            auVar151 = ZEXT3264(local_12b8);
            auVar109 = ZEXT3264(local_12d8);
            auVar113 = ZEXT3264(local_12f8);
            auVar158 = ZEXT3264(local_1318);
            auVar163 = ZEXT3264(local_1338);
          } while (local_1480 != lVar26);
        }
LAB_002e86a8:
      } while (puVar28 != &local_11d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }